

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t archive_read_format_tar_read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  tar *tar;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  mode_t mVar7;
  wchar_t wVar8;
  archive_string_conv *paVar9;
  archive_read *a_00;
  dev_t dVar10;
  int64_t iVar11;
  archive_acl *acl;
  int *piVar12;
  gnu_sparse *sparse;
  size_t min;
  char *pcVar13;
  wchar_t *pwVar14;
  size_t sVar15;
  undefined4 uVar16;
  long lVar17;
  wchar_t *pwVar18;
  char *pcVar20;
  ulong uVar21;
  char cVar22;
  long lVar23;
  void *pvVar24;
  char *pcVar25;
  size_t *in_R8;
  sparse_block *sb;
  sparse_block *psVar26;
  size_t local_80;
  undefined8 local_78;
  int local_6c;
  char *local_68;
  size_t sStack_60;
  size_t local_58;
  wchar_t local_48;
  undefined4 uStack_44;
  archive_string *local_40;
  char *local_38;
  wchar_t *pwVar19;
  
  local_80 = 0;
  archive_entry_set_dev(entry,(long)archive_read_format_tar_read_header::default_dev + 1);
  lVar23 = (long)archive_read_format_tar_read_header::default_inode;
  archive_read_format_tar_read_header::default_inode = (wchar_t)(lVar23 + 1);
  archive_entry_set_ino(entry,lVar23 + 1);
  if (L'\xfffe' < archive_read_format_tar_read_header::default_inode) {
    archive_read_format_tar_read_header::default_dev =
         archive_read_format_tar_read_header::default_dev + L'\x01';
    archive_read_format_tar_read_header::default_inode = L'\0';
  }
  tar = (tar *)a->format->data;
  tar->entry_offset = 0;
  while( true ) {
    psVar26 = tar->sparse_list;
    if (psVar26 == (sparse_block *)0x0) break;
    tar->sparse_list = psVar26->next;
    free(psVar26);
  }
  tar->sparse_last = (sparse_block *)0x0;
  tar->size_fields = '\0';
  tar->sconv = tar->opt_sconv;
  if (tar->opt_sconv == (archive_string_conv *)0x0) {
    if (tar->init_default_conversion == 0) {
      paVar9 = archive_string_default_conversion_for_read(&a->archive);
      tar->sconv_default = paVar9;
      tar->init_default_conversion = 1;
    }
    tar->sconv = tar->sconv_default;
  }
  tar->pax_hdrcharset_utf8 = 1;
  tar->sparse_gnu_attributes_seen = '\0';
  (tar->entry_gname).length = 0;
  (tar->entry_pathname).length = 0;
  (tar->entry_pathname_override).length = 0;
  (tar->entry_uname).length = 0;
  (tar->entry_linkpath).length = 0;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format = 0x30000;
    (a->archive).archive_format_name = "tar";
  }
  local_40 = &tar->localname;
  local_6c = 0;
  local_78 = (void *)((ulong)local_78._4_4_ << 0x20);
  uVar21 = local_80;
  wVar8 = L'\0';
LAB_001366dc:
  if (uVar21 != 0) {
    __archive_read_consume(a,uVar21);
    uVar21 = 0;
  }
  pvVar24 = (void *)0x200;
  a_00 = (archive_read *)__archive_read_ahead(a,0x200,(ssize_t *)&stack0xffffffffffffffc8);
  if (local_38 == (char *)0x0) {
    local_80 = uVar21;
    if (local_6c == 0) goto LAB_00137327;
    pcVar13 = "Damaged tar archive (end-of-archive within a sequence of headers)";
    iVar4 = 0x16;
LAB_001372b0:
    local_80 = uVar21;
    archive_set_error(&a->archive,iVar4,pcVar13);
  }
  else {
    if (a_00 == (archive_read *)0x0) {
      pcVar13 = "Truncated tar archive detected while reading next header";
      iVar4 = 0x54;
      goto LAB_001372b0;
    }
    if ((char)(a_00->archive).magic == '\0') {
      lVar23 = 0;
      do {
        cVar22 = *(char *)((long)&(a_00->archive).magic + lVar23);
        if (cVar22 != '\0') break;
        iVar4 = (int)lVar23;
        lVar23 = lVar23 + 1;
      } while (iVar4 != 0x1ff);
      if (cVar22 != '\0') goto LAB_00136750;
      uVar21 = 0x200;
      if (tar->read_concatenated_archives == 0) goto LAB_001372be;
      goto LAB_001366dc;
    }
LAB_00136750:
    local_80 = 0x200;
    wVar5 = checksum(a_00,pvVar24);
    if (wVar5 == L'\0') {
      __archive_read_consume(a,0x200);
      local_80 = 0;
      archive_set_error(&a->archive,0x16,"Damaged tar archive (bad header checksum)");
      uVar21 = 0xffffffe2;
      if (local_6c == 0) {
        uVar21 = 0xfffffff6;
      }
      goto LAB_0013732c;
    }
    bVar1 = a_00->field_0x9c;
    if (bVar1 < 0x56) {
      if (bVar1 == 0x41) {
        if (((ulong)local_78 & 1) != 0) goto LAB_001372b7;
        (a->archive).archive_format = 0x30002;
        (a->archive).archive_format_name = "Solaris tar";
        _local_48 = tar_atol((char *)((long)&(a_00->archive).read_data_remaining + 4),0xc);
        local_68 = (char *)0x0;
        sStack_60 = 0;
        local_58 = 0;
        wVar5 = read_body_to_string(a,(tar *)&stack0xffffffffffffff98,(archive_string *)a_00,
                                    &local_80,in_R8);
        if (wVar5 == L'\0') {
          pcVar13 = local_68 + _local_48;
          cVar22 = *local_68;
          pcVar25 = local_68;
          if ((long)_local_48 < 1 || cVar22 == '\0') {
            uVar21 = 0;
          }
          else {
            uVar21 = 0;
            do {
              pcVar25 = pcVar25 + 1;
              if ((byte)(cVar22 - 0x38U) < 0xf8) {
                pcVar13 = "Malformed Solaris ACL attribute (invalid digit)";
                goto LAB_00136f4e;
              }
              if (0xffffff < uVar21 << 3) {
                pcVar13 = "Malformed Solaris ACL attribute (count too large)";
                goto LAB_00136f4e;
              }
              uVar21 = uVar21 << 3 | (ulong)(byte)(cVar22 - 0x30);
              cVar22 = *pcVar25;
            } while ((cVar22 != '\0') && (pcVar25 < pcVar13));
          }
          if ((uVar21 & 0xfffffffffffc0000) == 0x40000) {
            uVar16 = 0x100;
LAB_00136e2f:
            if (pcVar25 + 1 < pcVar13) {
              _local_48 = CONCAT44(uStack_44,uVar16);
              lVar23 = 1;
              do {
                lVar17 = lVar23;
                if (pcVar25[lVar17] == '\0') break;
                lVar23 = lVar17 + 1;
              } while (pcVar25 + lVar17 < pcVar13);
              if (tar->sconv_acl == (archive_string_conv *)0x0) {
                paVar9 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
                tar->sconv_acl = paVar9;
                if (paVar9 == (archive_string_conv *)0x0) {
                  wVar5 = L'\xffffffe2';
                  goto LAB_00136f60;
                }
              }
              (tar->localname).length = 0;
              archive_strncat(local_40,pcVar25 + 1,lVar17 - 1);
              acl = archive_entry_acl(entry);
              wVar5 = archive_acl_from_text_l(acl,(tar->localname).s,local_48,tar->sconv_acl);
              mVar7 = archive_entry_perm(entry);
              archive_entry_set_perm(entry,mVar7);
              if (wVar5 != L'\0') {
                piVar12 = __errno_location();
                if (*piVar12 == 0xc) {
                  iVar4 = 0xc;
                  pcVar13 = "Can\'t allocate memory for ACL";
                }
                else {
                  iVar4 = -1;
                  pcVar13 = "Malformed Solaris ACL attribute (unparsable)";
                }
                archive_set_error(&a->archive,iVar4,pcVar13);
              }
              goto LAB_00136f60;
            }
            pcVar13 = "Malformed Solaris ACL attribute (body overflow)";
LAB_00136f4e:
            archive_set_error(&a->archive,-1,pcVar13);
          }
          else {
            if ((uVar21 & 0xfffffffffffc0000) == 0xc0000) {
              uVar16 = 0x3c00;
              goto LAB_00136e2f;
            }
            archive_set_error(&a->archive,-1,
                              "Malformed Solaris ACL attribute (unsupported type %lo)");
          }
          wVar5 = L'\xffffffec';
        }
LAB_00136f60:
        local_78 = (void *)((ulong)local_78 | 1);
LAB_00136f65:
        archive_string_free((archive_string *)&stack0xffffffffffffff98);
        goto LAB_001371d3;
      }
      if (bVar1 == 0x4b) {
        if (((ulong)local_78 & 4) == 0) {
          local_68 = (char *)0x0;
          sStack_60 = 0;
          local_58 = 0;
          wVar5 = read_body_to_string(a,(tar *)&stack0xffffffffffffff98,(archive_string *)a_00,
                                      &local_80,in_R8);
          if (wVar5 == L'\0') {
            archive_entry_set_link(entry,local_68);
          }
          local_78 = (void *)((ulong)local_78 | 4);
          goto LAB_00136f65;
        }
      }
      else {
        if (bVar1 != 0x4c) goto LAB_00136988;
        if (((ulong)local_78 & 8) == 0) {
          local_68 = (char *)0x0;
          sStack_60 = 0;
          local_58 = 0;
          wVar5 = read_body_to_string(a,(tar *)&stack0xffffffffffffff98,(archive_string *)a_00,
                                      &local_80,in_R8);
          if (wVar5 == L'\0') {
            wVar5 = _archive_entry_copy_pathname_l(entry,local_68,sStack_60,tar->sconv);
            if (wVar5 == L'\0') {
              wVar5 = L'\0';
            }
            else {
              wVar5 = set_conversion_failed_error(a,tar->sconv,"Pathname");
            }
          }
          local_78 = (void *)((ulong)local_78 | 8);
          goto LAB_00136f65;
        }
      }
      goto LAB_001372b7;
    }
    if (0x66 < bVar1) {
      if (bVar1 == 0x67) {
        if (((ulong)local_78 & 2) == 0) {
          local_78 = (void *)((ulong)local_78 | 2);
          (a->archive).archive_format = 0x30002;
          (a->archive).archive_format_name = "POSIX pax interchange format";
          lVar23 = tar_atol((char *)((long)&(a_00->archive).read_data_remaining + 4),0xc);
          wVar5 = L'\xffffffe2';
          if (lVar23 < 0x1000000000000000) goto LAB_00136ad4;
          goto LAB_001371d3;
        }
      }
      else {
        if (bVar1 != 0x78) goto LAB_00136988;
        if (((ulong)local_78 & 0x20) == 0) {
          (a->archive).archive_format = 0x30002;
          pcVar13 = "POSIX pax interchange format";
          goto LAB_00136884;
        }
      }
      goto LAB_001372b7;
    }
    if (bVar1 == 0x56) {
      if (((ulong)local_78 & 0x10) != 0) goto LAB_001372b7;
      local_78 = (void *)((ulong)local_78 | 0x10);
      lVar23 = tar_atol((char *)((long)&(a_00->archive).read_data_remaining + 4),0xc);
      wVar5 = L'\xffffffe2';
      if (lVar23 < 0x100001) {
LAB_00136ad4:
        local_80 = (lVar23 + 0x1ffU & 0xfffffffffffffe00) + 0x200;
        wVar5 = L'\0';
      }
    }
    else {
      if (bVar1 == 0x58) {
        if (((ulong)local_78 & 0x20) == 0) {
          (a->archive).archive_format = 0x30002;
          pcVar13 = "POSIX pax interchange format (Sun variant)";
LAB_00136884:
          local_78 = (void *)((ulong)local_78 | 0x20);
          (a->archive).archive_format_name = pcVar13;
          in_R8 = &local_80;
          wVar5 = header_pax_extension(a,tar,entry,a_00,in_R8);
          goto LAB_001371d3;
        }
        goto LAB_001372b7;
      }
LAB_00136988:
      if (*(long *)((long)&a_00->bidders[0].name + 1) == 0x20207261747375) {
        (a->archive).archive_format = 0x30004;
        (a->archive).archive_format_name = "GNU tar format";
        pcVar13 = archive_entry_pathname(entry);
        if (((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) &&
           (wVar5 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv),
           wVar5 != L'\0')) {
          wVar5 = set_conversion_failed_error(a,tar->sconv,"Pathname");
          wVar6 = L'\xffffffe2';
          if (wVar5 == L'\xffffffe2') goto LAB_00137026;
        }
        pcVar13 = archive_entry_uname(entry);
        if (((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) &&
           (wVar5 = _archive_entry_copy_uname_l
                              (entry,(char *)((long)&a_00->bidders[0].vtable + 1),0x20,tar->sconv),
           wVar5 != L'\0')) {
          wVar5 = set_conversion_failed_error(a,tar->sconv,"Uname");
          wVar6 = L'\xffffffe2';
          if (wVar5 == L'\xffffffe2') goto LAB_00137026;
        }
        pcVar13 = archive_entry_gname(entry);
        if (((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) &&
           (wVar5 = _archive_entry_copy_gname_l
                              (entry,(char *)((long)&a_00->bidders[2].data + 1),0x20,tar->sconv),
           wVar5 != L'\0')) {
          wVar5 = set_conversion_failed_error(a,tar->sconv,"Gname");
          wVar6 = L'\xffffffe2';
          if (wVar5 == L'\xffffffe2') goto LAB_00137026;
        }
        if ((byte)(a_00->field_0x9c - 0x33) < 2) {
          wVar5 = archive_entry_rdev_is_set(entry);
          if (wVar5 == L'\0') {
            dVar10 = tar_atol((char *)((long)&a_00->bidders[3].name + 1),8);
            archive_entry_set_rdevmajor(entry,dVar10);
            dVar10 = tar_atol((char *)((long)&a_00->bidders[3].vtable + 1),8);
            archive_entry_set_rdevminor(entry,dVar10);
          }
        }
        else {
          archive_entry_set_rdev(entry,0);
        }
        wVar5 = archive_entry_atime_is_set(entry);
        if ((wVar5 == L'\0') &&
           (iVar11 = tar_atol((char *)((long)&a_00->bidders[4].data + 1),0xc), 0 < iVar11)) {
          archive_entry_set_atime(entry,iVar11,0);
        }
        wVar5 = archive_entry_ctime_is_set(entry);
        if ((wVar5 == L'\0') &&
           (iVar11 = tar_atol((char *)((long)&a_00->bidders[4].name + 5),0xc), 0 < iVar11)) {
          archive_entry_set_ctime(entry,iVar11,0);
        }
        if (*(char *)((long)&a_00->bidders[9].vtable + 3) != '\0') {
          iVar11 = tar_atol((char *)((long)&a_00->bidders[9].vtable + 3),0xc);
          tar->GNU_sparse_realsize = iVar11;
          tar->size_fields = tar->size_fields | 2;
        }
        if (*(char *)((long)&a_00->bidders[5].vtable + 2) != '\0') {
          wVar5 = gnu_sparse_old_parse
                            (a,tar,(gnu_sparse *)((long)&a_00->bidders[5].vtable + 2),L'\x04');
          if (wVar5 != L'\0') {
LAB_00136e20:
            wVar6 = L'\xffffffe2';
            goto LAB_00137026;
          }
          uVar21 = local_80;
          if (*(char *)((long)&a_00->bidders[9].vtable + 2) != '\0') {
            do {
              if (uVar21 != 0) {
                __archive_read_consume(a,uVar21);
              }
              _local_48 = 0;
              sparse = (gnu_sparse *)
                       __archive_read_ahead(a,0x200,(ssize_t *)&stack0xffffffffffffff98);
              if (sparse == (gnu_sparse *)0x0) {
                local_80 = _local_48;
                archive_set_error(&a->archive,0x54,
                                  "Truncated tar archive detected while reading sparse file data");
                goto LAB_00136e20;
              }
              wVar5 = gnu_sparse_old_parse(a,tar,sparse,L'\x15');
              if (wVar5 != L'\0') {
                local_80 = 0x200;
                goto LAB_00136e20;
              }
              uVar21 = 0x200;
            } while (sparse[0x15].offset[0] != '\0');
            local_80 = 0x200;
            if (tar->sparse_list != (sparse_block *)0x0) {
              tar->entry_offset = tar->sparse_list->offset;
            }
          }
        }
        wVar5 = header_common(a,tar,entry,a_00);
        wVar6 = L'\xffffffe2';
        if (wVar5 != L'\xffffffe2') {
          tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
          wVar6 = wVar5;
        }
      }
      else if (*(char *)((long)&a_00->bidders[0].name + 5) == 'r' &&
               *(int *)((long)&a_00->bidders[0].name + 1) == 0x61747375) {
        if ((a->archive).archive_format != 0x30002) {
          (a->archive).archive_format = 0x30001;
          (a->archive).archive_format_name = "POSIX ustar format";
        }
        wVar6 = header_ustar(a,tar,entry,a_00);
      }
      else {
        (a->archive).archive_format = 0x30000;
        (a->archive).archive_format_name = "tar (non-POSIX)";
        pcVar13 = archive_entry_pathname(entry);
        pwVar14 = archive_entry_pathname_w(entry);
        if ((((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) &&
            ((pwVar14 == (wchar_t *)0x0 || (*pwVar14 == L'\0')))) &&
           (wVar5 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv),
           wVar5 != L'\0')) {
          wVar5 = set_conversion_failed_error(a,tar->sconv,"Pathname");
          wVar6 = L'\xffffffe2';
          if (wVar5 == L'\xffffffe2') goto LAB_00137026;
        }
        else {
          wVar5 = L'\0';
        }
        wVar6 = header_common(a,tar,entry,a_00);
        if (wVar5 < wVar6) {
          wVar6 = wVar5;
        }
        tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
      }
LAB_00137026:
      if (wVar8 < wVar6) {
        wVar6 = wVar8;
      }
      uVar21 = 0xffffffe2;
      if (wVar6 < L'\xffffffec') goto LAB_0013732c;
      if ((tar->process_mac_extensions == 0) ||
         (uVar3 = (ulong)local_78 & 0x200, local_78 = (void *)((ulong)local_78 & 0xffffffff00000200)
         , uVar3 != 0)) {
LAB_0013746f:
        if (tar->sparse_gnu_attributes_seen == '\0') {
LAB_00137513:
          uVar21 = (ulong)(uint)wVar6;
        }
        else {
          if ((tar->filetype == '0') || (tar->filetype == 'S')) {
            if (tar->sparse_gnu_major == 1) {
              if (tar->sparse_gnu_minor == 0) {
                uVar21 = gnu_sparse_10_read(a,tar,&local_80);
                if (-1 < (long)uVar21) {
                  tar->entry_bytes_remaining = tar->entry_bytes_remaining - uVar21;
                  goto LAB_00137513;
                }
                goto LAB_0013732c;
              }
            }
            else if ((tar->sparse_gnu_major == 0) && ((uint)tar->sparse_gnu_minor < 2)) {
              uVar21 = (ulong)(uint)wVar6;
              goto LAB_0013732c;
            }
            pcVar13 = "Unrecognized GNU sparse file format";
          }
          else {
            pcVar13 = "Non-regular file cannot be sparse";
          }
          archive_set_error(&a->archive,-1,pcVar13);
          uVar21 = 0xffffffec;
        }
        goto LAB_0013732c;
      }
      pwVar14 = archive_entry_pathname_w(entry);
      pwVar18 = pwVar14;
      if (pwVar14 == (wchar_t *)0x0) {
        pcVar13 = archive_entry_pathname(entry);
        pcVar25 = pcVar13;
        if (pcVar13 != (char *)0x0) {
          do {
            while( true ) {
              pcVar20 = pcVar25 + 1;
              cVar22 = *pcVar25;
              pcVar25 = pcVar20;
              if (cVar22 != '/') break;
              if (*pcVar20 != '\0') {
                pcVar13 = pcVar20;
              }
            }
          } while (cVar22 != '\0');
          if (((*pcVar13 != '.') || (pcVar13[1] != '_')) || (pcVar13[2] == '\0')) goto LAB_0013746f;
        }
      }
      else {
        do {
          while( true ) {
            pwVar19 = pwVar18 + 1;
            wVar8 = *pwVar18;
            pwVar18 = pwVar19;
            if (wVar8 != L'/') break;
            if (*pwVar19 != L'\0') {
              pwVar14 = pwVar19;
            }
          }
        } while (wVar8 != L'\0');
        if (((*pwVar14 != L'.') || (pwVar14[1] != L'_')) || (pwVar14[2] == L'\0'))
        goto LAB_0013746f;
      }
      min = archive_entry_size(entry);
      if ((long)min < 0) {
LAB_001371ab:
        local_80 = 0;
LAB_001371b4:
        wVar5 = L'\xffffffe2';
        bVar2 = true;
      }
      else {
        if (0x1000000 < (long)min) {
          in_R8 = (size_t *)0x1000000;
          archive_set_error(&a->archive,-1,"Oversized AppleDouble extension has size %llu > %llu",
                            min);
          goto LAB_001371b4;
        }
        if (local_80 != 0) {
          __archive_read_consume(a,local_80);
          local_80 = 0;
        }
        pvVar24 = __archive_read_ahead(a,min,(ssize_t *)0x0);
        if (pvVar24 == (void *)0x0) {
          archive_set_error(&a->archive,0x16,
                            "Truncated archive detected while reading macOS metadata");
          goto LAB_001371ab;
        }
        local_78 = pvVar24;
        archive_entry_clear(entry);
        archive_entry_copy_mac_metadata(entry,local_78,min);
        local_80 = min + 0x1ff & 0x7ffffffffffffe00;
        bVar2 = false;
        wVar5 = L'\0';
      }
      if (bVar2) goto LAB_0013732c;
      wVar8 = wVar6;
      if (wVar5 <= wVar6) {
        wVar8 = wVar5;
      }
      local_78 = (void *)CONCAT44(local_78._4_4_,0x200);
    }
LAB_001371d3:
    if (wVar8 < wVar5) {
      wVar5 = wVar8;
    }
    if (wVar5 != L'\xffffffe2') {
      uVar21 = local_80;
      wVar8 = wVar5;
      if (((ulong)local_78 & 0xffffffed) != 0) {
        local_6c = 1;
      }
      goto LAB_001366dc;
    }
  }
LAB_001372b7:
  uVar21 = 0xffffffe2;
  goto LAB_0013732c;
LAB_001372be:
  local_80 = 0x200;
  __archive_read_consume(a,0x200);
  local_80 = 0;
  pcVar13 = (char *)__archive_read_ahead(a,0x200,(ssize_t *)0x0);
  if ((pcVar13 != (char *)0x0) && (*pcVar13 == '\0')) {
    lVar23 = 0;
    do {
      pcVar25 = pcVar13 + lVar23;
      if (*pcVar25 != '\0') break;
      iVar4 = (int)lVar23;
      lVar23 = lVar23 + 1;
    } while (iVar4 != 0x1ff);
    if (*pcVar25 == '\0') {
      __archive_read_consume(a,0x200);
    }
  }
  archive_clear_error(&a->archive);
LAB_00137327:
  uVar21 = 1;
LAB_0013732c:
  if (local_80 != 0) {
    __archive_read_consume(a,local_80);
    local_80 = 0;
  }
  psVar26 = tar->sparse_list;
  if (psVar26 == (sparse_block *)0x0) {
    wVar8 = gnu_add_sparse_entry(a,tar,0,tar->entry_bytes_remaining);
    if (wVar8 != L'\0') {
      return L'\xffffffe2';
    }
  }
  else {
    do {
      if (psVar26->hole == 0) {
        archive_entry_sparse_add_entry(entry,psVar26->offset,psVar26->remaining);
      }
      psVar26 = psVar26->next;
    } while (psVar26 != (sparse_block *)0x0);
  }
  if (((wchar_t)uVar21 == L'\0') && (mVar7 = archive_entry_filetype(entry), mVar7 == 0x8000)) {
    pwVar14 = archive_entry_pathname_w(entry);
    if (pwVar14 == (wchar_t *)0x0) {
      pcVar13 = archive_entry_pathname(entry);
      if (pcVar13 == (char *)0x0) {
        return L'\0';
      }
      sVar15 = strlen(pcVar13);
      if (sVar15 == 0) {
        return L'\0';
      }
      if (pcVar13[sVar15 - 1] != '/') {
        return L'\0';
      }
    }
    else {
      sVar15 = wcslen(pwVar14);
      if (sVar15 == 0) {
        return L'\0';
      }
      if (pwVar14[sVar15 - 1] != L'/') {
        return L'\0';
      }
    }
    archive_entry_set_filetype(entry,0x4000);
    tar->entry_bytes_remaining = 0;
    tar->entry_padding = 0;
  }
  return (wchar_t)uVar21;
}

Assistant:

static int
tar_read_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, size_t *unconsumed)
{
	ssize_t bytes;
	int err = ARCHIVE_OK, err2;
	int eof_fatal = 0; /* EOF is okay at some points... */
	const char *h;
	const struct archive_entry_header_ustar *header;
	const struct archive_entry_header_gnutar *gnuheader;

	/* Bitmask of what header types we've seen. */
	int32_t seen_headers = 0;
	static const int32_t seen_A_header = 1;
	static const int32_t seen_g_header = 2;
	static const int32_t seen_K_header = 4;
	static const int32_t seen_L_header = 8;
	static const int32_t seen_V_header = 16;
	static const int32_t seen_x_header = 32; /* Also X */
	static const int32_t seen_mac_metadata = 512;

	tar->pax_hdrcharset_utf8 = 1;
	tar->sparse_gnu_attributes_seen = 0;
	archive_string_empty(&(tar->entry_gname));
	archive_string_empty(&(tar->entry_pathname));
	archive_string_empty(&(tar->entry_pathname_override));
	archive_string_empty(&(tar->entry_uname));
	archive_string_empty(&tar->entry_linkpath);

	/* Ensure format is set. */
	if (a->archive.archive_format_name == NULL) {
		a->archive.archive_format = ARCHIVE_FORMAT_TAR;
		a->archive.archive_format_name = "tar";
	}

	/*
	 * TODO: Write global/default pax options into
	 * 'entry' struct here before overwriting with
	 * file-specific options.
	 */

	/* Loop over all the headers needed for the next entry */
	for (;;) {

		/* Find the next valid header record. */
		while (1) {
			tar_flush_unconsumed(a, unconsumed);

			/* Read 512-byte header record */
			h = __archive_read_ahead(a, 512, &bytes);
			if (bytes == 0) { /* EOF at a block boundary. */
				if (eof_fatal) {
					/* We've read a special header already;
					 * if there's no regular header, then this is
					 * a premature EOF. */
					archive_set_error(&a->archive, EINVAL,
							  "Damaged tar archive (end-of-archive within a sequence of headers)");
					return (ARCHIVE_FATAL);
				} else {
					return (ARCHIVE_EOF);
				}
			}
			if (h == NULL) {  /* Short block at EOF; this is bad. */
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated tar archive"
				    " detected while reading next header");
				return (ARCHIVE_FATAL);
			}
			*unconsumed += 512;

			if (h[0] == 0 && archive_block_is_null(h)) {
				/* We found a NULL block which indicates end-of-archive */

				if (tar->read_concatenated_archives) {
					/* We're ignoring NULL blocks, so keep going. */
					continue;
				}

				/* Try to consume a second all-null record, as well. */
				/* If we can't, that's okay. */
				tar_flush_unconsumed(a, unconsumed);
				h = __archive_read_ahead(a, 512, NULL);
				if (h != NULL && h[0] == 0 && archive_block_is_null(h))
						__archive_read_consume(a, 512);

				archive_clear_error(&a->archive);
				return (ARCHIVE_EOF);
			}

			/* This is NOT a null block, so it must be a valid header. */
			if (!checksum(a, h)) {
				tar_flush_unconsumed(a, unconsumed);
				archive_set_error(&a->archive, EINVAL,
						  "Damaged tar archive (bad header checksum)");
				/* If we've read some critical information (pax headers, etc)
				 * and _then_ see a bad header, we can't really recover. */
				if (eof_fatal) {
					return (ARCHIVE_FATAL);
				} else {
					return (ARCHIVE_RETRY);
				}
			}
			break;
		}

		/* Determine the format variant. */
		header = (const struct archive_entry_header_ustar *)h;
		switch(header->typeflag[0]) {
		case 'A': /* Solaris tar ACL */
			if (seen_headers & seen_A_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_A_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "Solaris tar";
			err2 = header_Solaris_ACL(a, tar, entry, h, unconsumed);
			break;
		case 'g': /* POSIX-standard 'g' header. */
			if (seen_headers & seen_g_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_g_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "POSIX pax interchange format";
			err2 = header_pax_global(a, tar, entry, h, unconsumed);
			break;
		case 'K': /* Long link name (GNU tar, others) */
			if (seen_headers & seen_K_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_K_header;
			err2 = header_gnu_longlink(a, tar, entry, h, unconsumed);
			break;
		case 'L': /* Long filename (GNU tar, others) */
			if (seen_headers & seen_L_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_L_header;
			err2 = header_gnu_longname(a, tar, entry, h, unconsumed);
			break;
		case 'V': /* GNU volume header */
			if (seen_headers & seen_V_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_V_header;
			err2 = header_volume(a, tar, entry, h, unconsumed);
			break;
		case 'X': /* Used by SUN tar; same as 'x'. */
			if (seen_headers & seen_x_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_x_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name =
				"POSIX pax interchange format (Sun variant)";
			err2 = header_pax_extension(a, tar, entry, h, unconsumed);
			break;
		case 'x': /* POSIX-standard 'x' header. */
			if (seen_headers & seen_x_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_x_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "POSIX pax interchange format";
			err2 = header_pax_extension(a, tar, entry, h, unconsumed);
			break;
		default: /* Regular header: Legacy tar, GNU tar, or ustar */
			gnuheader = (const struct archive_entry_header_gnutar *)h;
			if (memcmp(gnuheader->magic, "ustar  \0", 8) == 0) {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
				a->archive.archive_format_name = "GNU tar format";
				err2 = header_gnutar(a, tar, entry, h, unconsumed);
			} else if (memcmp(header->magic, "ustar", 5) == 0) {
				if (a->archive.archive_format != ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
					a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
					a->archive.archive_format_name = "POSIX ustar format";
				}
				err2 = header_ustar(a, tar, entry, h);
			} else {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR;
				a->archive.archive_format_name = "tar (non-POSIX)";
				err2 = header_old_tar(a, tar, entry, h);
			}
			err = err_combine(err, err2);
			/* We return warnings or success as-is.  Anything else is fatal. */
			if (err < ARCHIVE_WARN) {
				return (ARCHIVE_FATAL);
			}
			/* Filename of the form `._filename` is an AppleDouble
			 * extension entry.  The body is the macOS metadata blob;
			 * this is followed by another entry with the actual
			 * regular file data.
			 * This design has two drawbacks:
			 * = it's brittle; you might just have a file with such a name
			 * = it duplicates any long pathname extensions
			 *
			 * TODO: This probably shouldn't be here at all.  Consider
			 * just returning the contents as a regular entry here and
			 * then dealing with it when we write data to disk.
			 */
			if (tar->process_mac_extensions
			    && ((seen_headers & seen_mac_metadata) == 0)
			    && is_mac_metadata_entry(entry)) {
				err2 = read_mac_metadata_blob(a, entry, unconsumed);
				if (err2 < ARCHIVE_WARN) {
					return (ARCHIVE_FATAL);
				}
				err = err_combine(err, err2);
				/* Note: Other headers can appear again. */
				seen_headers = seen_mac_metadata;
				break;
			}

			/* Reconcile GNU sparse attributes */
			if (tar->sparse_gnu_attributes_seen) {
				/* Only 'S' (GNU sparse) and ustar '0' regular files can be sparse */
				if (tar->filetype != 'S' && tar->filetype != '0') {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
							  "Non-regular file cannot be sparse");
					return (ARCHIVE_WARN);
				} else if (tar->sparse_gnu_major == 0 &&
				    tar->sparse_gnu_minor == 0) {
					/* Sparse map already parsed from 'x' header */
				} else if (tar->sparse_gnu_major == 0 &&
				    tar->sparse_gnu_minor == 1) {
					/* Sparse map already parsed from 'x' header */
				} else if (tar->sparse_gnu_major == 1 &&
				    tar->sparse_gnu_minor == 0) {
					/* Sparse map is prepended to file contents */
					ssize_t bytes_read;
					bytes_read = gnu_sparse_10_read(a, tar, unconsumed);
					if (bytes_read < 0)
						return ((int)bytes_read);
					tar->entry_bytes_remaining -= bytes_read;
				} else {
					archive_set_error(&a->archive,
							  ARCHIVE_ERRNO_MISC,
							  "Unrecognized GNU sparse file format");
					return (ARCHIVE_WARN);
				}
			}
			return (err);
		}

		/* We're between headers ... */
		err = err_combine(err, err2);
		if (err == ARCHIVE_FATAL)
			return (err);

		/* The GNU volume header and the pax `g` global header
		 * are both allowed to be the only header in an
		 * archive.  If we've seen any other header, a
		 * following EOF is fatal. */
		if ((seen_headers & ~seen_V_header & ~seen_g_header) != 0) {
			eof_fatal = 1;
		}
	}
}